

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.cpp
# Opt level: O2

int execute(string *executable,
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *args,string *input,string *output)

{
  pointer pcVar1;
  pointer pbVar2;
  uint __i;
  int iVar3;
  __pid_t _Var4;
  __sighandler_t p_Var5;
  long lVar6;
  ssize_t sVar7;
  size_type sVar8;
  ssize_t sVar9;
  string *psVar10;
  int *piVar11;
  char *pcVar12;
  char **__argv;
  ostream *poVar13;
  uint uVar14;
  ulong uVar15;
  int status;
  allocator<char> local_4169;
  int pout [2];
  int pin [2];
  timeval tv;
  fd_set wfds;
  fd_set rfds;
  char buf [16384];
  
  pcVar1 = (input->_M_dataplus)._M_p;
  p_Var5 = signal(0xd,(__sighandler_t)0x1);
  if (p_Var5 == (__sighandler_t)0xffffffffffffffff) {
    psVar10 = (string *)__cxa_allocate_exception(0x20);
    piVar11 = __errno_location();
    pcVar12 = strerror(*piVar11);
    std::__cxx11::string::string<std::allocator<char>>(psVar10,pcVar12,(allocator<char> *)&status);
  }
  else {
    iVar3 = pipe(pin);
    if (iVar3 == -1) {
      psVar10 = (string *)__cxa_allocate_exception(0x20);
      piVar11 = __errno_location();
      pcVar12 = strerror(*piVar11);
      std::__cxx11::string::string<std::allocator<char>>(psVar10,pcVar12,(allocator<char> *)&status)
      ;
    }
    else {
      iVar3 = pipe(pout);
      if (iVar3 == -1) {
        psVar10 = (string *)__cxa_allocate_exception(0x20);
        piVar11 = __errno_location();
        pcVar12 = strerror(*piVar11);
        std::__cxx11::string::string<std::allocator<char>>
                  (psVar10,pcVar12,(allocator<char> *)&status);
      }
      else {
        _Var4 = fork();
        if (_Var4 == 0) {
          close(pin[1]);
          close(pout[0]);
          iVar3 = dup2(pin[0],0);
          if (iVar3 == -1) {
            psVar10 = (string *)__cxa_allocate_exception(0x20);
            piVar11 = __errno_location();
            pcVar12 = strerror(*piVar11);
            std::__cxx11::string::string<std::allocator<char>>
                      (psVar10,pcVar12,(allocator<char> *)&status);
          }
          else {
            close(pin[0]);
            uVar14 = 1;
            iVar3 = dup2(pout[1],1);
            if (iVar3 != -1) {
              close(pout[1]);
              pbVar2 = (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              uVar15 = (long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5;
              __argv = (char **)operator_new__(-(ulong)(uVar15 + 2 >> 0x3d != 0) | uVar15 * 8 + 0x10
                                              );
              pcVar12 = (executable->_M_dataplus)._M_p;
              *__argv = pcVar12;
              for (; uVar14 - 1 < uVar15; uVar14 = uVar14 + 1) {
                __argv[uVar14] = pbVar2[uVar14 - 1]._M_dataplus._M_p;
              }
              __argv[uVar15 + 1] = (char *)0x0;
              iVar3 = execvp(pcVar12,__argv);
              poVar13 = std::operator<<((ostream *)&std::cerr,"Failed to execute \'");
              poVar13 = std::operator<<(poVar13,(string *)executable);
              poVar13 = std::operator<<(poVar13,"\' Error: ");
              piVar11 = __errno_location();
              pcVar12 = strerror(*piVar11);
              poVar13 = std::operator<<(poVar13,pcVar12);
              std::operator<<(poVar13,'\n');
              _exit(iVar3);
            }
            psVar10 = (string *)__cxa_allocate_exception(0x20);
            piVar11 = __errno_location();
            pcVar12 = strerror(*piVar11);
            std::__cxx11::string::string<std::allocator<char>>
                      (psVar10,pcVar12,(allocator<char> *)&status);
          }
        }
        else if (_Var4 == -1) {
          psVar10 = (string *)__cxa_allocate_exception(0x20);
          piVar11 = __errno_location();
          pcVar12 = strerror(*piVar11);
          std::__cxx11::string::string<std::allocator<char>>
                    (psVar10,pcVar12,(allocator<char> *)&status);
        }
        else {
          close(pin[0]);
          close(pout[1]);
          if (input->_M_string_length == 0) {
            close(pin[1]);
          }
          std::__cxx11::string::assign((char *)output);
          sVar9 = -1;
          uVar14 = 0;
          while( true ) {
            do {
              sVar8 = input->_M_string_length;
              uVar15 = (ulong)uVar14;
              if (((int)sVar9 == 0) && (sVar8 == uVar15)) {
                close(pout[0]);
                status = -1;
                _Var4 = wait(&status);
                if (_Var4 == -1) {
                  psVar10 = (string *)__cxa_allocate_exception(0x20);
                  piVar11 = __errno_location();
                  pcVar12 = strerror(*piVar11);
                  std::__cxx11::string::string<std::allocator<char>>(psVar10,pcVar12,&local_4169);
                  __cxa_throw(psVar10,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string)
                  ;
                }
                if ((status & 0x7fU) != 0) {
                  psVar10 = (string *)__cxa_allocate_exception(0x20);
                  std::__cxx11::string::string<std::allocator<char>>
                            (psVar10,"Error: Could not get Hook exit status!",&local_4169);
                  __cxa_throw(psVar10,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string)
                  ;
                }
                status = (uint)status >> 8 & 0xff;
                p_Var5 = signal(0xd,(__sighandler_t)0x0);
                if (p_Var5 == (__sighandler_t)0xffffffffffffffff) {
                  psVar10 = (string *)__cxa_allocate_exception(0x20);
                  piVar11 = __errno_location();
                  pcVar12 = strerror(*piVar11);
                  std::__cxx11::string::string<std::allocator<char>>(psVar10,pcVar12,&local_4169);
                  __cxa_throw(psVar10,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string)
                  ;
                }
                return status;
              }
              for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
                rfds.fds_bits[lVar6] = 0;
              }
              if ((int)sVar9 != 0) {
                rfds.fds_bits[pout[0] / 0x40] =
                     rfds.fds_bits[pout[0] / 0x40] | 1L << ((byte)pout[0] & 0x3f);
              }
              for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
                wfds.fds_bits[lVar6] = 0;
              }
              if (sVar8 != uVar15) {
                wfds.fds_bits[pin[1] / 0x40] =
                     wfds.fds_bits[pin[1] / 0x40] | 1L << ((byte)pin[1] & 0x3f);
              }
              tv.tv_sec = 5;
              tv.tv_usec = 0;
              iVar3 = pin[1];
              if (pin[1] < pout[0]) {
                iVar3 = pout[0];
              }
              iVar3 = select(iVar3 + 1,(fd_set *)&rfds,(fd_set *)&wfds,(fd_set *)0x0,(timeval *)&tv)
              ;
              if (iVar3 == -1) {
                psVar10 = (string *)__cxa_allocate_exception(0x20);
                piVar11 = __errno_location();
                pcVar12 = strerror(*piVar11);
                std::__cxx11::string::string<std::allocator<char>>
                          (psVar10,pcVar12,(allocator<char> *)&status);
                goto LAB_001124cf;
              }
              if (((ulong)wfds.fds_bits[pin[1] / 0x40] >> ((long)pin[1] % 0x40 & 0x3fU) & 1) != 0) {
                sVar7 = write(pin[1],pcVar1 + uVar15,input->_M_string_length - uVar15);
                iVar3 = (int)sVar7;
                if (iVar3 == -1) {
                  piVar11 = __errno_location();
                  if (*piVar11 != 0x20) {
                    psVar10 = (string *)__cxa_allocate_exception(0x20);
                    pcVar12 = strerror(*piVar11);
                    std::__cxx11::string::string<std::allocator<char>>
                              (psVar10,pcVar12,(allocator<char> *)&status);
                    goto LAB_001124cf;
                  }
                  sVar8 = input->_M_string_length;
                  iVar3 = (int)sVar8 - uVar14;
                }
                else {
                  sVar8 = input->_M_string_length;
                }
                uVar14 = iVar3 + uVar14;
                if (sVar8 == uVar14) {
                  close(pin[1]);
                }
              }
            } while (((ulong)rfds.fds_bits[pout[0] / 0x40] >> ((long)pout[0] % 0x40 & 0x3fU) & 1) ==
                     0);
            sVar9 = read(pout[0],buf,0x3fff);
            if ((int)sVar9 == -1) break;
            buf[(int)sVar9] = '\0';
            std::__cxx11::string::append((char *)output);
          }
          psVar10 = (string *)__cxa_allocate_exception(0x20);
          piVar11 = __errno_location();
          pcVar12 = strerror(*piVar11);
          std::__cxx11::string::string<std::allocator<char>>
                    (psVar10,pcVar12,(allocator<char> *)&status);
        }
      }
    }
  }
LAB_001124cf:
  __cxa_throw(psVar10,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

int execute (
  const std::string& executable,
  const std::vector <std::string>& args,
  const std::string& input,
  std::string& output)
{
  pid_t pid;
  int pin[2], pout[2];
  fd_set rfds, wfds;
  struct timeval tv;
  int select_retval, read_retval, write_retval;
  char buf[16384];
  unsigned int written;
  const char* input_cstr = input.c_str ();

  if (signal (SIGPIPE, SIG_IGN) == SIG_ERR) // Handled locally with EPIPE.
    throw std::string (std::strerror (errno));

  if (pipe (pin) == -1)
    throw std::string (std::strerror (errno));

  if (pipe (pout) == -1)
    throw std::string (std::strerror (errno));

  if ((pid = fork ()) == -1)
    throw std::string (std::strerror (errno));

  if (pid == 0)
  {
    // This is only reached in the child
    close (pin[1]);   // Close the write end of the input pipe.
    close (pout[0]);  // Close the read end of the output pipe.

    // Parent writes to pin[1]. Set read end pin[0] as STDIN for child.
    if (dup2 (pin[0], STDIN_FILENO) == -1)
      throw std::string (std::strerror (errno));
    close (pin[0]);

    // Parent reads from pout[0]. Set write end pout[1] as STDOUT for child.
    if (dup2 (pout[1], STDOUT_FILENO) == -1)
      throw std::string (std::strerror (errno));
    close (pout[1]);

    // Add executable as argv[0] and NULL-terminate the array for execvp().
    char** argv = new char* [args.size () + 2];
    argv[0] = (char*) executable.c_str ();
    for (unsigned int i = 0; i < args.size (); ++i)
      argv[i+1] = (char*) args[i].c_str ();

    argv[args.size () + 1] = nullptr;
    int rc = execvp (executable.c_str (), argv);
    std::cerr << "Failed to execute '" << executable << "' Error: " << strerror (errno) << '\n';
    _exit (rc);
  }

  // This is only reached in the parent
  close (pin[0]);   // Close the read end of the input pipe.
  close (pout[1]);  // Close the write end of the output pipe.

  if (input.empty ())
  {
    // Nothing to send to the child, close the pipe early.
    close (pin[1]);
  }

  output = "";
  read_retval = -1;
  written = 0;
  while (read_retval != 0 || input.size () != written)
  {
    FD_ZERO (&rfds);
    if (read_retval != 0)
      FD_SET (pout[0], &rfds);

    FD_ZERO (&wfds);
    if (input.size () != written)
      FD_SET (pin[1], &wfds);

    // On Linux, tv may be overwritten by select().  Reset it each time.
    // NOTE: Timeout chosen arbitrarily - we don't time out execute() calls.
    // select() is run over and over again unless the child exits or closes
    // its pipes.
    tv.tv_sec = 5;
    tv.tv_usec = 0;

    select_retval = select (std::max (pout[0], pin[1]) + 1, &rfds, &wfds, nullptr, &tv);

    if (select_retval == -1)
      throw std::string (std::strerror (errno));

    // Write data to child's STDIN
    if (FD_ISSET (pin[1], &wfds))
    {
      write_retval = write (pin[1], input_cstr + written, input.size () - written);
      if (write_retval == -1)
      {
        if (errno == EPIPE)
        {
          // Child died (or closed the pipe) before reading all input.
          // We don't really care; pretend we wrote it all.
          write_retval = input.size () - written;
        }
        else
        {
          throw std::string (std::strerror (errno));
        }
      }
      written += write_retval;

      if (written == input.size ())
      {
        // Let the child know that no more input is coming by closing the pipe.
        close (pin[1]);
      }
    }

    // Read data from child's STDOUT
    if (FD_ISSET (pout[0], &rfds))
    {
      read_retval = read (pout[0], &buf, sizeof (buf) - 1);
      if (read_retval == -1)
        throw std::string (std::strerror (errno));

      buf[read_retval] = '\0';
      output += buf;
    }
  }

  close (pout[0]);  // Close the read end of the output pipe.

  int status = -1;
  if (wait (&status) == -1)
    throw std::string (std::strerror (errno));

  if (WIFEXITED (status))
  {
    status = WEXITSTATUS (status);
  }
  else
  {
    throw std::string ("Error: Could not get Hook exit status!");
  }

  if (signal (SIGPIPE, SIG_DFL) == SIG_ERR)  // We're done, return to default.
    throw std::string (std::strerror (errno));

  return status;
}